

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLuint texture_00;
  bool bVar2;
  int local_24;
  GLuint texture;
  int width;
  int y;
  int x;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _y = argv;
  argv_local._0_4_ = argc;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  windows[0] = open_window("First",(GLFWwindow *)0x0,0x32,0x32);
  if (windows[0] == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  texture_00 = create_texture();
  glfwGetWindowPos(windows[0],&width,(int *)&texture);
  glfwGetWindowSize(windows[0],&local_24,(int *)0x0);
  windows[1] = open_window("Second",windows[0],width + local_24 + 0x32,texture);
  if (windows[1] == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(windows[0]);
  (*glad_glColor3f)(0.6,0.0,0.6);
  glfwMakeContextCurrent(windows[1]);
  (*glad_glColor3f)(0.6,0.6,0.0);
  glfwMakeContextCurrent(windows[0]);
  while( true ) {
    iVar1 = glfwWindowShouldClose(windows[0]);
    bVar2 = false;
    if (iVar1 == 0) {
      iVar1 = glfwWindowShouldClose(windows[1]);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    glfwMakeContextCurrent(windows[0]);
    draw_quad(texture_00);
    glfwMakeContextCurrent(windows[1]);
    draw_quad(texture_00);
    glfwSwapBuffers(windows[0]);
    glfwSwapBuffers(windows[1]);
    glfwWaitEvents();
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int x, y, width;
    GLuint texture;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    windows[0] = open_window("First", NULL, OFFSET, OFFSET);
    if (!windows[0])
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // This is the one and only time we create a texture
    // It is created inside the first context, created above
    // It will then be shared with the second context, created below
    texture = create_texture();

    glfwGetWindowPos(windows[0], &x, &y);
    glfwGetWindowSize(windows[0], &width, NULL);

    // Put the second window to the right of the first one
    windows[1] = open_window("Second", windows[0], x + width + OFFSET, y);
    if (!windows[1])
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // Set drawing color for both contexts
    glfwMakeContextCurrent(windows[0]);
    glColor3f(0.6f, 0.f, 0.6f);
    glfwMakeContextCurrent(windows[1]);
    glColor3f(0.6f, 0.6f, 0.f);

    glfwMakeContextCurrent(windows[0]);

    while (!glfwWindowShouldClose(windows[0]) &&
           !glfwWindowShouldClose(windows[1]))
    {
        glfwMakeContextCurrent(windows[0]);
        draw_quad(texture);

        glfwMakeContextCurrent(windows[1]);
        draw_quad(texture);

        glfwSwapBuffers(windows[0]);
        glfwSwapBuffers(windows[1]);

        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}